

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iter.cpp
# Opt level: O1

int main(int param_1,char **param_2)

{
  long *plVar1;
  int iVar2;
  ulong uVar3;
  ostream *poVar4;
  undefined4 in_register_0000003c;
  long lVar5;
  float val;
  iterator *src [2];
  int i [5];
  double d [3];
  source<int> si;
  source<double> sd;
  float local_ec;
  undefined ***local_e8 [4];
  undefined4 local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined **local_98;
  undefined ****local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined **local_60;
  undefined8 *local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 local_30;
  
  mtrace(CONCAT44(in_register_0000003c,param_1));
  local_58 = &local_b8;
  local_b8 = 0x3ff0000000000000;
  uStack_b0 = 0xc010000000000000;
  local_a8 = 0x4053800000000000;
  local_50 = 0x18;
  local_60 = &PTR_value_00104c78;
  local_48 = 0;
  uStack_40 = 0;
  local_30 = 0x6400000001;
  local_38 = 0;
  local_90 = local_e8 + 2;
  local_e8[2] = (undefined ***)0x200000001;
  local_e8[3] = (undefined ***)0x400000003;
  local_c8 = 5;
  local_88 = 0x14;
  local_98 = &PTR_value_00104cf8;
  local_80 = 0;
  uStack_78 = 0;
  local_68 = 0x69fffffffe;
  local_70 = 4;
  local_e8[0] = &local_60;
  local_e8[1] = &local_98;
  lVar5 = 0;
  do {
    plVar1 = *(long **)((long)local_e8 + lVar5);
    while( true ) {
      uVar3 = (**(code **)*plVar1)(plVar1);
      if (uVar3 == 0) break;
      iVar2 = mpt::value::convert(uVar3,(void *)0x66);
      if (iVar2 < 0) break;
      poVar4 = std::ostream::_M_insert<double>((double)local_ec);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      (**(code **)(*plVar1 + 8))(plVar1);
    }
    lVar5 = lVar5 + 8;
    if (lVar5 == 0x10) {
      return 0;
    }
  } while( true );
}

Assistant:

extern int main(int , char * const [])
{
	float val;
	mtrace();
	
	const double d[] = { 1, -4, 78 };
	mpt::source<double> sd(d, 3);
	
	const int i[] = { 1, 2, 3, 4, 5 };
	mpt::source<int> si(i, 5, -2);
	
	mpt::iterator *src[] = { &sd, &si };
	
	for (mpt::iterator *it : src) {
		while (it->get(val)) {
			std::cout << val << std::endl;
			it->advance();
		}
	}
	
	return 0;
}